

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

void __thiscall
irr::core::array<irr::scene::ISkinnedMesh::SPositionKey>::erase
          (array<irr::scene::ISkinnedMesh::SPositionKey> *this,u32 index,s32 count)

{
  pointer pSVar1;
  size_t __n;
  u32 uVar2;
  ulong uVar3;
  int iVar4;
  pointer pSVar5;
  pointer __src;
  
  if (0 < count) {
    pSVar5 = (this->m_data).
             super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->m_data).
             super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (long)pSVar1 - (long)pSVar5 >> 4;
    if (index < uVar3) {
      uVar2 = (u32)uVar3;
      iVar4 = uVar2 - index;
      if (count <= iVar4) {
        iVar4 = count;
      }
      if (uVar2 != index) {
        pSVar5 = pSVar5 + index;
        __src = pSVar5 + iVar4;
        __n = (long)pSVar1 - (long)__src;
        if (__n != 0) {
          memmove(pSVar5,__src,__n);
        }
        pSVar1 = (this->m_data).
                 super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pSVar5 = (pointer)((long)pSVar5 + ((long)pSVar1 - (long)__src));
        if (pSVar1 != pSVar5) {
          (this->m_data).
          super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void erase(u32 index, s32 count)
	{
		if (index >= m_data.size() || count < 1)
			return;
		count = core::min_(count, (s32)m_data.size() - (s32)index);
		auto first = std::next(m_data.begin(), index);
		auto last = std::next(first, count);
		m_data.erase(first, last);
	}